

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_mac(mbedtls_md_context_t *md_ctx,uchar *secret,uchar *buf,size_t len,uchar *ctr,int type)

{
  size_t __n;
  size_t ilen;
  byte bVar1;
  mbedtls_md_type_t mVar2;
  uchar *output;
  ulong ilen_00;
  uchar header [11];
  uchar padding [48];
  undefined8 local_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  size_t local_70;
  uchar local_68 [56];
  
  local_70 = len;
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  mVar2 = mbedtls_md_get_type(md_ctx->md_info);
  ilen = local_70;
  __n = (ulong)(mVar2 == MBEDTLS_MD_MD5) * 8 + 0x28;
  local_80 = *(undefined8 *)ctr;
  local_78 = (undefined1)type;
  local_77 = (undefined1)(local_70 >> 8);
  local_76 = (undefined1)local_70;
  memset(local_68,0x36,__n);
  mbedtls_md_starts(md_ctx);
  ilen_00 = (ulong)bVar1;
  mbedtls_md_update(md_ctx,secret,ilen_00);
  mbedtls_md_update(md_ctx,local_68,__n);
  mbedtls_md_update(md_ctx,(uchar *)&local_80,0xb);
  mbedtls_md_update(md_ctx,buf,ilen);
  output = buf + ilen;
  mbedtls_md_finish(md_ctx,output);
  memset(local_68,0x5c,__n);
  mbedtls_md_starts(md_ctx);
  mbedtls_md_update(md_ctx,secret,ilen_00);
  mbedtls_md_update(md_ctx,local_68,__n);
  mbedtls_md_update(md_ctx,output,ilen_00);
  mbedtls_md_finish(md_ctx,output);
  return;
}

Assistant:

static void ssl_mac( mbedtls_md_context_t *md_ctx, unsigned char *secret,
                     unsigned char *buf, size_t len,
                     unsigned char *ctr, int type )
{
    unsigned char header[11];
    unsigned char padding[48];
    int padlen;
    int md_size = mbedtls_md_get_size( md_ctx->md_info );
    int md_type = mbedtls_md_get_type( md_ctx->md_info );

    /* Only MD5 and SHA-1 supported */
    if( md_type == MBEDTLS_MD_MD5 )
        padlen = 48;
    else
        padlen = 40;

    memcpy( header, ctr, 8 );
    header[ 8] = (unsigned char)  type;
    header[ 9] = (unsigned char)( len >> 8 );
    header[10] = (unsigned char)( len      );

    memset( padding, 0x36, padlen );
    mbedtls_md_starts( md_ctx );
    mbedtls_md_update( md_ctx, secret,  md_size );
    mbedtls_md_update( md_ctx, padding, padlen  );
    mbedtls_md_update( md_ctx, header,  11      );
    mbedtls_md_update( md_ctx, buf,     len     );
    mbedtls_md_finish( md_ctx, buf +    len     );

    memset( padding, 0x5C, padlen );
    mbedtls_md_starts( md_ctx );
    mbedtls_md_update( md_ctx, secret,    md_size );
    mbedtls_md_update( md_ctx, padding,   padlen  );
    mbedtls_md_update( md_ctx, buf + len, md_size );
    mbedtls_md_finish( md_ctx, buf + len          );
}